

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

monster * group_monster_tracking(chunk *c,monster *mon)

{
  _Bool _Var1;
  monster *pmVar2;
  monster *tracker;
  mon_group_list_entry_conflict *entry;
  monster_group_conflict *group;
  wchar_t index;
  monster *mon_local;
  chunk *c_local;
  
  tracker = (monster *)c->monster_groups[mon->group_info[0].index]->member_list;
  while( true ) {
    if (tracker == (monster *)0x0) {
      return (monster *)0x0;
    }
    pmVar2 = (monster *)cave_monster((chunk_conflict *)c,*(wchar_t *)&tracker->race);
    if (((pmVar2 != mon) &&
        (_Var1 = flag_has_dbg(pmVar2->mflag,2,10,"tracker->mflag","MFLAG_TRACKING"), _Var1)) &&
       (_Var1 = flag_has_dbg(pmVar2->mflag,2,2,"tracker->mflag","MFLAG_ACTIVE"), _Var1)) break;
    tracker = (monster *)tracker->original_race;
  }
  return pmVar2;
}

Assistant:

struct monster *group_monster_tracking(struct chunk *c,
									   const struct monster *mon)
{
	int index = mon->group_info[PRIMARY_GROUP].index;
	struct monster_group *group = c->monster_groups[index];
	struct mon_group_list_entry *entry = group->member_list;

	while (entry) {
		struct monster *tracker = cave_monster(c, entry->midx);
		if (tracker != mon &&
				mflag_has(tracker->mflag, MFLAG_TRACKING) &&
				mflag_has(tracker->mflag, MFLAG_ACTIVE)) {
			return tracker;
		}
		entry = entry->next;
	}

	return NULL;
}